

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast.h
# Opt level: O0

object __thiscall
pybind11::detail::object_api<pybind11::handle>::operator()
          (object_api<pybind11::handle> *this,cpp_function *args,none *args_1,none *args_2,
          char (*args_3) [1])

{
  handle *this_00;
  char (*in_R9) [1];
  PyObject local_40;
  char (*args_local_3) [1];
  none *args_local_2;
  none *args_local_1;
  cpp_function *args_local;
  object_api<pybind11::handle> *this_local;
  
  args_local_3 = args_3;
  args_local_2 = args_2;
  args_local_1 = args_1;
  args_local = args;
  this_local = this;
  collect_arguments<(pybind11::return_value_policy)1,pybind11::cpp_function,pybind11::none,pybind11::none,char_const(&)[1],void>
            ((detail *)&local_40,(cpp_function *)args_1,args_2,(none *)args_3,in_R9);
  this_00 = derived((object_api<pybind11::handle> *)args);
  handle::ptr(this_00);
  simple_collector<(pybind11::return_value_policy)1>::call
            ((simple_collector<(pybind11::return_value_policy)1> *)this,&local_40);
  simple_collector<(pybind11::return_value_policy)1>::~simple_collector
            ((simple_collector<(pybind11::return_value_policy)1> *)&local_40);
  return (object)(handle)this;
}

Assistant:

object object_api<Derived>::operator()(Args &&...args) const {
    return detail::collect_arguments<policy>(std::forward<Args>(args)...).call(derived().ptr());
}